

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_target(AMQP_VALUE value,TARGET_HANDLE *target_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_70;
  AMQP_VALUE capabilities_array;
  char *capabilities;
  node_properties dynamic_node_properties;
  _Bool dynamic;
  seconds timeout;
  terminus_expiry_policy expiry_policy;
  AMQP_VALUE pAStack_40;
  terminus_durability durable;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  TARGET_INSTANCE *target_instance;
  TARGET_HANDLE *ppTStack_18;
  int result;
  TARGET_HANDLE *target_handle_local;
  AMQP_VALUE value_local;
  
  ppTStack_18 = target_handle;
  target_handle_local = (TARGET_HANDLE *)value;
  list_value = (AMQP_VALUE)target_create_internal();
  *ppTStack_18 = (TARGET_HANDLE)list_value;
  if (*ppTStack_18 == (TARGET_HANDLE)0x0) {
    target_instance._4_4_ = 0x34ef;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)target_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      target_destroy(*ppTStack_18);
      target_instance._4_4_ = 0x34f7;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,0), pAStack_40 != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy(pAStack_40);
        }
        if ((1 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,1), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint(pAStack_40,(uint32_t *)((long)&expiry_policy + 4)),
             iVar1 != 0)) {
            amqpvalue_destroy(pAStack_40);
            target_destroy(*ppTStack_18);
            return 0x3527;
          }
          amqpvalue_destroy(pAStack_40);
        }
        if ((2 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,2), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_symbol(pAStack_40,(char **)&stack0xffffffffffffffb0), iVar1 != 0
             )) {
            amqpvalue_destroy(pAStack_40);
            target_destroy(*ppTStack_18);
            return 0x3544;
          }
          amqpvalue_destroy(pAStack_40);
        }
        if ((3 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,3), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint(pAStack_40,(uint32_t *)((long)&dynamic_node_properties + 4)
                                        ), iVar1 != 0)) {
            amqpvalue_destroy(pAStack_40);
            target_destroy(*ppTStack_18);
            return 0x3561;
          }
          amqpvalue_destroy(pAStack_40);
        }
        if ((4 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,4), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_boolean
                                (pAStack_40,(_Bool *)((long)&dynamic_node_properties + 3)),
             iVar1 != 0)) {
            amqpvalue_destroy(pAStack_40);
            target_destroy(*ppTStack_18);
            return 0x357e;
          }
          amqpvalue_destroy(pAStack_40);
        }
        if ((5 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,5), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_map(pAStack_40,(AMQP_VALUE *)&capabilities), iVar1 != 0)) {
            amqpvalue_destroy(pAStack_40);
            target_destroy(*ppTStack_18);
            return 0x359b;
          }
          amqpvalue_destroy(pAStack_40);
        }
        if ((6 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,6), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if (AVar2 != AMQP_TYPE_NULL) {
            capabilities_array = (AMQP_VALUE)0x0;
            AVar2 = amqpvalue_get_type(pAStack_40);
            if (((AVar2 != AMQP_TYPE_ARRAY) ||
                (iVar1 = amqpvalue_get_array(pAStack_40,&local_70), iVar1 != 0)) &&
               (iVar1 = amqpvalue_get_symbol(pAStack_40,(char **)&capabilities_array), iVar1 != 0))
            {
              amqpvalue_destroy(pAStack_40);
              target_destroy(*ppTStack_18);
              return 0x35ba;
            }
          }
          amqpvalue_destroy(pAStack_40);
        }
        pAVar3 = amqpvalue_clone((AMQP_VALUE)target_handle_local);
        *(AMQP_VALUE *)list_value = pAVar3;
        target_instance._4_4_ = 0;
      }
      else {
        target_instance._4_4_ = 0x34fe;
      }
    }
  }
  return target_instance._4_4_;
}

Assistant:

int amqpvalue_get_target(AMQP_VALUE value, TARGET_HANDLE* target_handle)
{
    int result;
    TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target_create_internal();
    *target_handle = target_instance;
    if (*target_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            target_destroy(*target_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* address */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* durable */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_durability durable;
                                if (amqpvalue_get_terminus_durability(item_value, &durable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* expiry-policy */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_expiry_policy expiry_policy;
                                if (amqpvalue_get_terminus_expiry_policy(item_value, &expiry_policy) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* timeout */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                seconds timeout;
                                if (amqpvalue_get_seconds(item_value, &timeout) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool dynamic;
                                if (amqpvalue_get_boolean(item_value, &dynamic) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic-node-properties */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                node_properties dynamic_node_properties;
                                if (amqpvalue_get_node_properties(item_value, &dynamic_node_properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* capabilities */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* capabilities = NULL;
                                AMQP_VALUE capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    target_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}